

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseOneof
          (Parser *this,OneofDescriptorProto *oneof_decl,DescriptorProto *containing_type,
          int oneof_index,LocationRecorder *oneof_location,
          LocationRecorder *containing_type_location,FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  OneofOptions *options;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *this_00;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  LocationRecorder name_location;
  
  text._M_str = "oneof";
  text._M_len = 5;
  bVar1 = Consume(this,text);
  if (bVar1) {
    LocationRecorder::LocationRecorder(&name_location,oneof_location,1);
    output = OneofDescriptorProto::_internal_mutable_name_abi_cxx11_(oneof_decl);
    bVar1 = ConsumeIdentifier(this,output,(ErrorMaker)ZEXT816(0x3708d5));
    LocationRecorder::~LocationRecorder(&name_location);
    if ((bVar1) &&
       (text_00._M_str = "{", text_00._M_len = 1,
       bVar1 = ConsumeEndOfDeclaration(this,text_00,oneof_location), bVar1)) {
      do {
        if ((this->input_->current_).type == TYPE_END) {
          RecordError(this,(ErrorMaker)ZEXT816(0x3708ea));
          return false;
        }
        text_01._M_str = "option";
        text_01._M_len = 6;
        bVar1 = LookingAt(this,text_01);
        if (bVar1) {
          LocationRecorder::LocationRecorder(&name_location,oneof_location,2);
          options = OneofDescriptorProto::mutable_options(oneof_decl);
          bVar1 = ParseOption(this,&options->super_Message,&name_location,containing_file,
                              OPTION_STATEMENT);
          LocationRecorder::~LocationRecorder(&name_location);
          if (!bVar1) {
            return false;
          }
        }
        else {
          text_02._M_str = "required";
          text_02._M_len = 8;
          bVar1 = LookingAt(this,text_02);
          if (((bVar1) ||
              (text_03._M_str = "optional", text_03._M_len = 8, bVar1 = LookingAt(this,text_03),
              bVar1)) ||
             (text_04._M_str = "repeated", text_04._M_len = 8, bVar1 = LookingAt(this,text_04),
             bVar1)) {
            RecordError(this,(ErrorMaker)ZEXT816(0x37092b));
            io::Tokenizer::Next(this->input_);
          }
          LocationRecorder::LocationRecorder
                    (&name_location,containing_type_location,2,
                     *(int *)((long)&containing_type->field_0 + 0x10));
          this_00 = internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                              (&(containing_type->field_0)._impl_.field_.super_RepeatedPtrFieldBase)
          ;
          FieldDescriptorProto::set_label(this_00,FieldDescriptorProto_Label_LABEL_OPTIONAL);
          (this_00->field_0)._impl_.oneof_index_ = oneof_index;
          *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 0x80;
          bVar1 = ParseMessageFieldNoLabel
                            (this,this_00,&(containing_type->field_0)._impl_.nested_type_,
                             containing_type_location,3,&name_location,containing_file);
          if (!bVar1) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder(&name_location);
        }
        text_05._M_str = "}";
        text_05._M_len = 1;
        bVar1 = TryConsumeEndOfDeclaration(this,text_05,(LocationRecorder *)0x0);
      } while (!bVar1);
      return true;
    }
  }
  return false;
}

Assistant:

bool Parser::ParseOneof(OneofDescriptorProto* oneof_decl,
                        DescriptorProto* containing_type, int oneof_index,
                        const LocationRecorder& oneof_location,
                        const LocationRecorder& containing_type_location,
                        const FileDescriptorProto* containing_file) {
  DO(Consume("oneof"));

  {
    LocationRecorder name_location(oneof_location,
                                   OneofDescriptorProto::kNameFieldNumber);
    DO(ConsumeIdentifier(oneof_decl->mutable_name(), "Expected oneof name."));
  }

  DO(ConsumeEndOfDeclaration("{", &oneof_location));

  do {
    if (AtEnd()) {
      RecordError("Reached end of input in oneof definition (missing '}').");
      return false;
    }

    if (LookingAt("option")) {
      LocationRecorder option_location(
          oneof_location, OneofDescriptorProto::kOptionsFieldNumber);
      if (!ParseOption(oneof_decl->mutable_options(), option_location,
                       containing_file, OPTION_STATEMENT)) {
        return false;
      }
      continue;
    }

    // Print a nice error if the user accidentally tries to place a label
    // on an individual member of a oneof.
    if (LookingAt("required") || LookingAt("optional") ||
        LookingAt("repeated")) {
      RecordError(
          "Fields in oneofs must not have labels (required / optional "
          "/ repeated).");
      // We can continue parsing here because we understand what the user
      // meant.  The error report will still make parsing fail overall.
      input_->Next();
    }

    LocationRecorder field_location(containing_type_location,
                                    DescriptorProto::kFieldFieldNumber,
                                    containing_type->field_size());

    FieldDescriptorProto* field = containing_type->add_field();
    field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
    field->set_oneof_index(oneof_index);

    if (!ParseMessageFieldNoLabel(field, containing_type->mutable_nested_type(),
                                  containing_type_location,
                                  DescriptorProto::kNestedTypeFieldNumber,
                                  field_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", nullptr));

  return true;
}